

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.hpp
# Opt level: O0

void duckdb::Bit::NumericToBit<signed_char>(char numeric,bitstring_t *output_str)

{
  bool bVar1;
  char *pcVar2;
  bitstring_t *str;
  idx_t idx;
  const_data_ptr_t data;
  char *output;
  string_t *in_stack_ffffffffffffffe0;
  char local_1;
  
  pcVar2 = string_t::GetDataWriteable(in_stack_ffffffffffffffe0);
  str = (bitstring_t *)const_data_ptr_cast<signed_char>(&local_1);
  *pcVar2 = '\0';
  bVar1 = false;
  while (!bVar1) {
    pcVar2[1] = *(char *)&str->value;
    bVar1 = true;
  }
  Finalize(str);
  return;
}

Assistant:

void Bit::NumericToBit(T numeric, bitstring_t &output_str) {
	D_ASSERT(output_str.GetSize() >= sizeof(T) + 1);

	auto output = output_str.GetDataWriteable();
	auto data = const_data_ptr_cast(&numeric);

	*output = 0; // set padding to 0
	++output;
	for (idx_t idx = 0; idx < sizeof(T); ++idx) {
		output[idx] = static_cast<char>(data[sizeof(T) - idx - 1]);
	}
	Bit::Finalize(output_str);
}